

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void Bind(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  SymbolType SVar3;
  uint32 uVar4;
  BOOL BVar5;
  uint uVar6;
  ParseNodeJump *pPVar7;
  ParseNodeProg *pnode_00;
  ParseNodeFnc *pPVar8;
  ParseNodePtr scope;
  Scope *pSVar9;
  Symbol *pSVar10;
  Symbol *pSVar11;
  undefined4 *puVar12;
  ParseNodeName *this;
  Symbol **ppSVar13;
  ParseNode *pPVar14;
  ParseNode *pPVar15;
  ParseNodeBin *pPVar16;
  ParseNodeStr *pPVar17;
  FuncInfo *pFVar18;
  ParseNodeStmt *pnodeStmt;
  ParseNodeVar *pPVar19;
  FunctionBody *this_00;
  ParseNodeRegExp *pPVar20;
  ParseNodeBlock *pPVar21;
  ParseNodeCatch *pPVar22;
  ParseNodeWith *pPVar23;
  ParseNode *local_58;
  ParseNode *pnodeScope;
  ParseNode *id;
  Symbol *sym;
  ParseNodeName *pnodeName;
  Symbol *funcVarSym;
  Symbol *funcSym;
  FuncInfo *funcInfo;
  FuncInfo *globFuncInfo;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  if (pnode != (ParseNode *)0x0) {
    switch(pnode->nop) {
    case knopName:
      this = ParseNode::AsParseNodeName(pnode);
      if (this->sym == (Symbol *)0x0) {
        if (((this->super_ParseNode).grfpn & 0x2000) != 0) {
          return;
        }
        ppSVar13 = ParseNodeName::GetSymRef(this);
        pSVar10 = ByteCodeGenerator::FindSymbol(byteCodeGenerator,ppSVar13,this->pid,false);
        if (pSVar10 != (Symbol *)0x0) {
          pPVar14 = Symbol::GetDecl(pSVar10);
          if ((pPVar14 != (ParseNode *)0x0) &&
             ((ppSVar13 = ParseNodeName::GetSymRef(this), ppSVar13 == (Symbol **)0x0 ||
              (ppSVar13 = ParseNodeName::GetSymRef(this), *ppSVar13 == (Symbol *)0x0)))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0x115f,
                               "(!sym->GetDecl() || (pnodeName->GetSymRef() && *pnodeName->GetSymRef()))"
                               ,
                               "!sym->GetDecl() || (pnodeName->GetSymRef() && *pnodeName->GetSymRef())"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          pPVar14 = Symbol::GetDecl(pSVar10);
          if (pPVar14 != (ParseNode *)0x0) {
            ppSVar13 = ParseNodeName::GetSymRef(this);
            pPVar14 = Symbol::GetDecl(*ppSVar13);
            pPVar15 = Symbol::GetDecl(pSVar10);
            if (pPVar14 != pPVar15) {
              ppSVar13 = ParseNodeName::GetSymRef(this);
              pSVar11 = Symbol::GetFuncScopeVarSym(*ppSVar13);
              if (pSVar11 != pSVar10) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0x1161,
                                   "(!sym->GetDecl() || ((*pnodeName->GetSymRef())->GetDecl() == sym->GetDecl()) || ((*pnodeName->GetSymRef())->GetFuncScopeVarSym() == sym))"
                                   ,
                                   "!sym->GetDecl() || ((*pnodeName->GetSymRef())->GetDecl() == sym->GetDecl()) || ((*pnodeName->GetSymRef())->GetFuncScopeVarSym() == sym)"
                                  );
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 0;
              }
            }
          }
          this->sym = pSVar10;
          SVar3 = Symbol::GetSymbolType(pSVar10);
          if ((SVar3 == STFunction) &&
             ((bVar2 = Symbol::GetIsGlobal(pSVar10), !bVar2 ||
              (uVar4 = ByteCodeGenerator::GetFlags(byteCodeGenerator), (uVar4 & 0x400) != 0)))) {
            pSVar9 = Symbol::GetScope(pSVar10);
            ByteCodeGenerator::FuncEscapes(byteCodeGenerator,pSVar9);
          }
        }
      }
      if (this->sym != (Symbol *)0x0) {
        Symbol::SetIsUsed(this->sym,true);
      }
      break;
    case knopRegExp:
      pFVar18 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
      this_00 = FuncInfo::GetParsedFunctionBody(pFVar18);
      uVar6 = Js::FunctionBody::NewLiteralRegex(this_00);
      pPVar20 = ParseNode::AsParseNodeRegExp(pnode);
      pPVar20->regexPatternIndex = uVar6;
      break;
    case knopTypeof:
    case knopDelete:
    case knopCall:
      BindReference(pnode,byteCodeGenerator);
      break;
    case knopDot:
      BindInstAndMember(pnode,byteCodeGenerator);
      break;
    case knopAsg:
      BindReference(pnode,byteCodeGenerator);
      CheckLocalVarDef(pnode,byteCodeGenerator);
      break;
    case knopComma:
      pPVar16 = ParseNode::AsParseNodeBin(pnode);
      ParseNode::SetNotEscapedUse(pPVar16->pnode1);
      break;
    case knopIndex:
      BindReference(pnode,byteCodeGenerator);
      break;
    case knopMember:
    case knopMemberShort:
    case knopSetMember:
    case knopGetMember:
    case knopObjectPatternMember:
      pPVar16 = ParseNode::AsParseNodeBin(pnode);
      pPVar14 = pPVar16->pnode1;
      if (pPVar14->nop == knopStr) {
        pPVar17 = ParseNode::AsParseNodeStr(pPVar14);
        ByteCodeGenerator::AssignPropertyId(byteCodeGenerator,pPVar17->pid);
        pPVar14->grfpn = pPVar14->grfpn | 0x2000;
      }
      break;
    case knopVarDecl:
      pPVar19 = ParseNode::AsParseNodeVar(pnode);
      if (pPVar19->sym == (Symbol *)0x0) {
        pPVar19 = ParseNode::AsParseNodeVar(pnode);
        ppSVar13 = pPVar19->symRef;
        pPVar19 = ParseNode::AsParseNodeVar(pnode);
        pSVar10 = ByteCodeGenerator::FindSymbol(byteCodeGenerator,ppSVar13,pPVar19->pid,false);
        pPVar19 = ParseNode::AsParseNodeVar(pnode);
        pPVar19->sym = pSVar10;
      }
      SetAdditionalBindInfoForVariables(pnode,byteCodeGenerator);
      break;
    case knopConstDecl:
    case knopLetDecl:
      pPVar19 = ParseNode::AsParseNodeVar(pnode);
      if (pPVar19->sym == (Symbol *)0x0) {
        pPVar19 = ParseNode::AsParseNodeVar(pnode);
        if ((pPVar19->symRef == (Symbol **)0x0) ||
           (pPVar19 = ParseNode::AsParseNodeVar(pnode), *pPVar19->symRef == (Symbol *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x11a3,
                             "(pnode->AsParseNodeVar()->symRef && *pnode->AsParseNodeVar()->symRef)"
                             ,"\'const\' and \'let\' should be binded when we bind block");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        pPVar19 = ParseNode::AsParseNodeVar(pnode);
        pSVar10 = *pPVar19->symRef;
        pPVar19 = ParseNode::AsParseNodeVar(pnode);
        pPVar19->sym = pSVar10;
      }
      SetAdditionalBindInfoForVariables(pnode,byteCodeGenerator);
      break;
    case knopFncDecl:
      pPVar8 = ParseNode::AsParseNodeFnc(pnode);
      bVar2 = ParseNodeFnc::IsCoroutine(pPVar8);
      if (bVar2) {
        pFVar18 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        pSVar9 = FuncInfo::GetBodyScope(pFVar18);
        ByteCodeGenerator::FuncEscapes(byteCodeGenerator,pSVar9);
      }
      pPVar8 = ParseNode::AsParseNodeFnc(pnode);
      bVar2 = ParseNodeFnc::IsDeclaration(pPVar8);
      if (bVar2) {
        BVar5 = ByteCodeGenerator::IsInLoop(byteCodeGenerator);
        if (BVar5 != 0) {
          pPVar8 = ParseNode::AsParseNodeFnc(pnode);
          pSVar10 = ParseNodeFnc::GetFuncSymbol(pPVar8);
          if ((pSVar10 != (Symbol *)0x0) &&
             (pSVar11 = Symbol::GetFuncScopeVarSym(pSVar10), pSVar11 != (Symbol *)0x0)) {
            if (pSVar11 == pSVar10) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                 ,0x1149,"(funcVarSym != funcSym)","funcVarSym != funcSym");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 0;
            }
            Symbol::SetIsUsed(pSVar11,true);
          }
        }
      }
      else {
        pFVar18 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        bVar2 = FuncInfo::IsGlobalFunction(pFVar18);
        if ((!bVar2) ||
           (uVar4 = ByteCodeGenerator::GetFlags(byteCodeGenerator), (uVar4 & 0x400) != 0)) {
          pSVar9 = FuncInfo::GetBodyScope(pFVar18);
          ByteCodeGenerator::FuncEscapes(byteCodeGenerator,pSVar9);
        }
        ByteCodeGenerator::ProcessCapturedSyms(byteCodeGenerator,pnode);
      }
      break;
    case knopProg:
      pnode_00 = ParseNode::AsParseNodeProg(pnode);
      pFVar18 = ByteCodeGenerator::StartBindGlobalStatements(byteCodeGenerator,pnode_00);
      pPVar8 = ParseNode::AsParseNodeFnc(pnode);
      pPVar8->funcInfo = pFVar18;
      pPVar8 = ParseNode::AsParseNodeFnc(pnode);
      scope = ParseNodeFnc::GetTopLevelScope(pPVar8);
      AddFunctionsToScope(scope,byteCodeGenerator);
      pPVar8 = ParseNode::AsParseNodeFnc(pnode);
      AddVarsToScope(pPVar8->pnodeVars,byteCodeGenerator);
      uVar4 = ByteCodeGenerator::GetFlags(byteCodeGenerator);
      ByteCodeGenerator::SetNumberOfInArgs(byteCodeGenerator,(ushort)((uVar4 & 0x800) != 0));
      uVar4 = ByteCodeGenerator::GetFlags(byteCodeGenerator);
      bVar2 = FuncInfo::IsFakeGlobalFunction(pFVar18,uVar4);
      if (bVar2) {
        if (pFVar18->byteCodeFunction != (ParseableFunctionInfo *)0x0) {
          Js::FunctionProxy::SetIsTopLevel(&pFVar18->byteCodeFunction->super_FunctionProxy,false);
        }
      }
      else {
        ByteCodeGenerator::SetRootFuncInfo(byteCodeGenerator,pFVar18);
      }
      pPVar8 = ParseNode::AsParseNodeFnc(pnode);
      bVar2 = ParseNodeFnc::CallsEval(pPVar8);
      if (bVar2) {
        FuncInfo::SetCallsEval(pFVar18,true);
      }
      break;
    case knopBlock:
      pPVar21 = ParseNode::AsParseNodeBlock(pnode);
      local_58 = pPVar21->pnodeScopes;
      while (local_58 != (ParseNode *)0x0) {
        switch(local_58->nop) {
        case knopFncDecl:
          pPVar8 = ParseNode::AsParseNodeFnc(local_58);
          bVar2 = ParseNodeFnc::IsDeclaration(pPVar8);
          if (bVar2) {
            ByteCodeGenerator::ProcessCapturedSyms(byteCodeGenerator,local_58);
          }
          pPVar8 = ParseNode::AsParseNodeFnc(local_58);
          local_58 = pPVar8->pnodeNext;
          break;
        case knopBlock:
          pPVar21 = ParseNode::AsParseNodeBlock(local_58);
          local_58 = pPVar21->pnodeNext;
          break;
        case knopWith:
          pPVar23 = ParseNode::AsParseNodeWith(local_58);
          local_58 = pPVar23->pnodeNext;
          break;
        case knopCatch:
          pPVar22 = ParseNode::AsParseNodeCatch(local_58);
          local_58 = pPVar22->pnodeNext;
        }
      }
      break;
    case knopBreak:
    case knopContinue:
      pPVar7 = ParseNode::AsParseNodeJump(pnode);
      ByteCodeGenerator::AddTargetStmt(byteCodeGenerator,pPVar7->pnodeTarget);
      break;
    case knopTryFinally:
      ByteCodeGenerator::SetHasFinally(byteCodeGenerator,true);
    case knopTryCatch:
      ByteCodeGenerator::SetHasTry(byteCodeGenerator,true);
      pFVar18 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
      Js::ParseableFunctionInfo::SetDontInline(pFVar18->byteCodeFunction,true);
      pnodeStmt = ParseNode::AsParseNodeStmt(pnode);
      ByteCodeGenerator::AddTargetStmt(byteCodeGenerator,pnodeStmt);
    }
  }
  return;
}

Assistant:

void Bind(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (pnode == nullptr)
{
        return;
    }

    switch (pnode->nop)
    {
    case knopBreak:
    case knopContinue:
        byteCodeGenerator->AddTargetStmt(pnode->AsParseNodeJump()->pnodeTarget);
        break;
    case knopProg:
        {
            FuncInfo* globFuncInfo = byteCodeGenerator->StartBindGlobalStatements(pnode->AsParseNodeProg());
            pnode->AsParseNodeFnc()->funcInfo = globFuncInfo;
            AddFunctionsToScope(pnode->AsParseNodeFnc()->GetTopLevelScope(), byteCodeGenerator);
            AddVarsToScope(pnode->AsParseNodeFnc()->pnodeVars, byteCodeGenerator);
            // There are no args to add, but "eval" gets a this pointer.
            byteCodeGenerator->SetNumberOfInArgs(!!(byteCodeGenerator->GetFlags() & fscrEvalCode));
            if (!globFuncInfo->IsFakeGlobalFunction(byteCodeGenerator->GetFlags()))
            {
                // Global code: the root function is the global function.
                byteCodeGenerator->SetRootFuncInfo(globFuncInfo);
            }
            else if (globFuncInfo->byteCodeFunction)
            {
            // If the current global code wasn't marked to be treated as global code (e.g. from deferred parsing),
            // we don't need to send a register script event for it.
                globFuncInfo->byteCodeFunction->SetIsTopLevel(false);
            }
            if (pnode->AsParseNodeFnc()->CallsEval())
            {
                globFuncInfo->SetCallsEval(true);
            }
            break;
        }
    case knopFncDecl:
        if (pnode->AsParseNodeFnc()->IsCoroutine())
        {
            // Always assume generator functions escape since tracking them requires tracking
            // the resulting generators in addition to the function.
            byteCodeGenerator->FuncEscapes(byteCodeGenerator->TopFuncInfo()->GetBodyScope());
        }
        if (!pnode->AsParseNodeFnc()->IsDeclaration())
        {
            FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();
            if (!funcInfo->IsGlobalFunction() || (byteCodeGenerator->GetFlags() & fscrEval))
            {
                // In the case of a nested function expression, assumes that it escapes.
                // We could try to analyze what it touches to be more precise.
                byteCodeGenerator->FuncEscapes(funcInfo->GetBodyScope());
            }
            byteCodeGenerator->ProcessCapturedSyms(pnode);
        }
        else if (byteCodeGenerator->IsInLoop())
        {
            Symbol *funcSym = pnode->AsParseNodeFnc()->GetFuncSymbol();
            if (funcSym)
            {
                Symbol *funcVarSym = funcSym->GetFuncScopeVarSym();
                if (funcVarSym)
                {
                    // We're going to write to the funcVarSym when we do the function instantiation,
                    // so treat the funcVarSym as used. That way, we know it will get undef-initialized at the
                    // top of the function, so a jitted loop body won't have any issue with boxing if
                    // the function instantiation isn't executed.
                    Assert(funcVarSym != funcSym);
                    funcVarSym->SetIsUsed(true);
                }
            }
        }
        break;
    case knopName:
    {
        ParseNodeName * pnodeName = pnode->AsParseNodeName();
        if (pnodeName->sym == nullptr)
        {
            if (pnodeName->grfpn & fpnMemberReference)
            {
                // This is a member name. No binding.
                break;
            }

            Symbol *sym = byteCodeGenerator->FindSymbol(pnodeName->GetSymRef(), pnodeName->pid);
            if (sym)
            {
                // This is a named load, not just a reference, so if it's a nested function note that all
                // the nested scopes escape.
                Assert(!sym->GetDecl() || (pnodeName->GetSymRef() && *pnodeName->GetSymRef()));
                Assert(!sym->GetDecl() || ((*pnodeName->GetSymRef())->GetDecl() == sym->GetDecl()) ||
                       ((*pnodeName->GetSymRef())->GetFuncScopeVarSym() == sym));

                pnodeName->sym = sym;
                if (sym->GetSymbolType() == STFunction &&
                    (!sym->GetIsGlobal() || (byteCodeGenerator->GetFlags() & fscrEval)))
                {
                    byteCodeGenerator->FuncEscapes(sym->GetScope());
                }
            }
        }

        if (pnodeName->sym)
        {
            pnodeName->sym->SetIsUsed(true);
        }

        break;
    }
    case knopMember:
    case knopMemberShort:
    case knopObjectPatternMember:
    case knopGetMember:
    case knopSetMember:

        {
            // lhs is knopStr, rhs is expr
            ParseNode *id = pnode->AsParseNodeBin()->pnode1;
            if (id->nop == knopStr)
            {
                byteCodeGenerator->AssignPropertyId(id->AsParseNodeStr()->pid);
                id->grfpn |= fpnMemberReference;
            }
            break;
        }

        // TODO: convert index over string to Get/Put Value
    case knopIndex:
        BindReference(pnode, byteCodeGenerator);
        break;
    case knopDot:
        BindInstAndMember(pnode, byteCodeGenerator);
        break;
    case knopTryFinally:
        byteCodeGenerator->SetHasFinally(true);
    case knopTryCatch:
        byteCodeGenerator->SetHasTry(true);
        byteCodeGenerator->TopFuncInfo()->byteCodeFunction->SetDontInline(true);
        byteCodeGenerator->AddTargetStmt(pnode->AsParseNodeStmt());
        break;
    case knopAsg:
        BindReference(pnode, byteCodeGenerator);
        CheckLocalVarDef(pnode, byteCodeGenerator);
        break;
    case knopVarDecl:
        // "arguments" symbol or decl w/o RHS may have been bound already; otherwise, do the binding here.
        if (pnode->AsParseNodeVar()->sym == nullptr)
        {
            pnode->AsParseNodeVar()->sym = byteCodeGenerator->FindSymbol(pnode->AsParseNodeVar()->symRef, pnode->AsParseNodeVar()->pid);
        }
        SetAdditionalBindInfoForVariables(pnode, byteCodeGenerator);
        break;
    case knopConstDecl:
    case knopLetDecl:
        // "arguments" symbol or decl w/o RHS may have been bound already; otherwise, do the binding here.
        if (!pnode->AsParseNodeVar()->sym)
        {
            AssertMsg(pnode->AsParseNodeVar()->symRef && *pnode->AsParseNodeVar()->symRef, "'const' and 'let' should be binded when we bind block");
            pnode->AsParseNodeVar()->sym = *pnode->AsParseNodeVar()->symRef;
        }
        SetAdditionalBindInfoForVariables(pnode, byteCodeGenerator);
        break;
    case knopCall:
    case knopTypeof:
    case knopDelete:
        BindReference(pnode, byteCodeGenerator);
        break;

    case knopRegExp:
        pnode->AsParseNodeRegExp()->regexPatternIndex = byteCodeGenerator->TopFuncInfo()->GetParsedFunctionBody()->NewLiteralRegex();
        break;

    case knopComma:
        pnode->AsParseNodeBin()->pnode1->SetNotEscapedUse();
        break;

    case knopBlock:
    {
        for (ParseNode *pnodeScope = pnode->AsParseNodeBlock()->pnodeScopes; pnodeScope; /* no increment */)
        {
            switch (pnodeScope->nop)
            {
            case knopFncDecl:
                if (pnodeScope->AsParseNodeFnc()->IsDeclaration())
                {
                    byteCodeGenerator->ProcessCapturedSyms(pnodeScope);
                }
                pnodeScope = pnodeScope->AsParseNodeFnc()->pnodeNext;
                break;

            case knopBlock:
                pnodeScope = pnodeScope->AsParseNodeBlock()->pnodeNext;
                break;

            case knopCatch:
                pnodeScope = pnodeScope->AsParseNodeCatch()->pnodeNext;
                break;

            case knopWith:
                pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
                break;
            }
        }
        break;
    }

    }
}